

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O1

void __thiscall
tinygltf::AnimationSampler::AnimationSampler(AnimationSampler *this,AnimationSampler *param_1)

{
  pointer pcVar1;
  int iVar2;
  
  iVar2 = param_1->output;
  this->input = param_1->input;
  this->output = iVar2;
  (this->interpolation)._M_dataplus._M_p = (pointer)&(this->interpolation).field_2;
  pcVar1 = (param_1->interpolation)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->interpolation,pcVar1,
             pcVar1 + (param_1->interpolation)._M_string_length);
  Value::Value(&this->extras,&param_1->extras);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::_Rb_tree(&(this->extensions)._M_t,&(param_1->extensions)._M_t);
  (this->extras_json_string)._M_dataplus._M_p = (pointer)&(this->extras_json_string).field_2;
  pcVar1 = (param_1->extras_json_string)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->extras_json_string,pcVar1,
             pcVar1 + (param_1->extras_json_string)._M_string_length);
  (this->extensions_json_string)._M_dataplus._M_p = (pointer)&(this->extensions_json_string).field_2
  ;
  pcVar1 = (param_1->extensions_json_string)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->extensions_json_string,pcVar1,
             pcVar1 + (param_1->extensions_json_string)._M_string_length);
  return;
}

Assistant:

AnimationSampler() : interpolation("LINEAR") {}